

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPIfClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPIfClause *this)

{
  ulong uVar1;
  string local_78;
  OpenMPIfClauseModifier local_58;
  allocator<char> local_51;
  OpenMPIfClauseModifier modifier;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPIfClause *local_18;
  OpenMPIfClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPIfClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"if ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&modifier,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_58 = getModifier(this);
  switch(local_58) {
  case OMPC_IF_MODIFIER_parallel:
    std::__cxx11::string::operator+=((string *)&modifier,"parallel");
    break;
  case OMPC_IF_MODIFIER_simd:
    std::__cxx11::string::operator+=((string *)&modifier,"simd");
    break;
  case OMPC_IF_MODIFIER_task:
    std::__cxx11::string::operator+=((string *)&modifier,"task");
    break;
  case OMPC_IF_MODIFIER_cancel:
    std::__cxx11::string::operator+=((string *)&modifier,"cancel");
    break;
  case OMPC_IF_MODIFIER_target_data:
    std::__cxx11::string::operator+=((string *)&modifier,"target data");
    break;
  case OMPC_IF_MODIFIER_target_enter_data:
    std::__cxx11::string::operator+=((string *)&modifier,"target enter data");
    break;
  case OMPC_IF_MODIFIER_target_exit_data:
    std::__cxx11::string::operator+=((string *)&modifier,"target exit data");
    break;
  case OMPC_IF_MODIFIER_target:
    std::__cxx11::string::operator+=((string *)&modifier,"target");
    break;
  case OMPC_IF_MODIFIER_target_update:
    std::__cxx11::string::operator+=((string *)&modifier,"target update");
    break;
  case OMPC_IF_MODIFIER_taskloop:
    std::__cxx11::string::operator+=((string *)&modifier,"taskloop");
  }
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    std::__cxx11::string::operator+=((string *)&modifier,": ");
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_78,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&modifier,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator+=((string *)&modifier,") ");
  uVar1 = std::__cxx11::string::size();
  if (2 < uVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&modifier);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&modifier);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPIfClause::toString() {

    std::string result = "if ";
    std::string clause_string = "(";
    OpenMPIfClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_IF_MODIFIER_parallel:
            clause_string += "parallel";
            break;
        case OMPC_IF_MODIFIER_simd:
            clause_string += "simd";
            break;
        case OMPC_IF_MODIFIER_task:
            clause_string += "task";
            break;
        case OMPC_IF_MODIFIER_taskloop:
            clause_string += "taskloop";
            break;
        case OMPC_IF_MODIFIER_cancel:
            clause_string += "cancel";
            break;
        case OMPC_IF_MODIFIER_target_data:
            clause_string += "target data";
            break;
        case OMPC_IF_MODIFIER_target_enter_data:
            clause_string += "target enter data";
            break;
        case OMPC_IF_MODIFIER_target_exit_data:
            clause_string += "target exit data";
            break;
        case OMPC_IF_MODIFIER_target:
            clause_string += "target";
            break;
        case OMPC_IF_MODIFIER_target_update:
            clause_string += "target update";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += ": ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 2) {
        result += clause_string;
    };

    return result;
}